

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plain_client.cpp
# Opt level: O0

void __thiscall zmq::plain_client_t::produce_hello(plain_client_t *this,msg_t *msg_)

{
  undefined1 uVar1;
  int iVar2;
  ulong uVar3;
  int *piVar4;
  char *pcVar5;
  undefined4 *puVar6;
  void *pvVar7;
  size_t sVar8;
  long lVar9;
  undefined1 *puVar10;
  undefined1 *__dest;
  long in_RDI;
  uchar *ptr;
  char *errstr;
  int rc;
  size_t command_size;
  string password;
  string username;
  size_t in_stack_ffffffffffffff30;
  msg_t *in_stack_ffffffffffffff38;
  string local_60 [48];
  string local_30 [48];
  
  std::__cxx11::string::string(local_30,(string *)(in_RDI + 0x2c0));
  uVar3 = std::__cxx11::string::length();
  if (0xff < uVar3) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","username.length () <= UCHAR_MAX",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/plain_client.cpp"
            ,0x79);
    fflush(_stderr);
    zmq_abort((char *)0x3172a6);
  }
  std::__cxx11::string::string(local_60,(string *)(in_RDI + 0x2e0));
  uVar3 = std::__cxx11::string::length();
  if (0xff < uVar3) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","password.length () <= UCHAR_MAX",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/plain_client.cpp"
            ,0x7c);
    fflush(_stderr);
    zmq_abort((char *)0x317348);
  }
  std::__cxx11::string::length();
  std::__cxx11::string::length();
  iVar2 = msg_t::init_size(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  if (iVar2 != 0) {
    piVar4 = __errno_location();
    pcVar5 = strerror(*piVar4);
    fprintf(_stderr,"%s (%s:%d)\n",pcVar5,
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/plain_client.cpp"
            ,0x83);
    fflush(_stderr);
    zmq_abort((char *)0x31742a);
  }
  puVar6 = (undefined4 *)msg_t::data(in_stack_ffffffffffffff38);
  *puVar6 = 0x4c454805;
  *(undefined2 *)(puVar6 + 1) = 0x4f4c;
  uVar1 = std::__cxx11::string::length();
  *(undefined1 *)((long)puVar6 + 6) = uVar1;
  pvVar7 = (void *)std::__cxx11::string::c_str();
  sVar8 = std::__cxx11::string::length();
  memcpy((void *)((long)puVar6 + 7),pvVar7,sVar8);
  lVar9 = std::__cxx11::string::length();
  puVar10 = (undefined1 *)(lVar9 + (long)puVar6 + 7);
  uVar1 = std::__cxx11::string::length();
  __dest = puVar10 + 1;
  *puVar10 = uVar1;
  pvVar7 = (void *)std::__cxx11::string::c_str();
  sVar8 = std::__cxx11::string::length();
  memcpy(__dest,pvVar7,sVar8);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void zmq::plain_client_t::produce_hello (msg_t *msg_) const
{
    const std::string username = options.plain_username;
    zmq_assert (username.length () <= UCHAR_MAX);

    const std::string password = options.plain_password;
    zmq_assert (password.length () <= UCHAR_MAX);

    const size_t command_size = hello_prefix_len + brief_len_size
                                + username.length () + brief_len_size
                                + password.length ();

    const int rc = msg_->init_size (command_size);
    errno_assert (rc == 0);

    unsigned char *ptr = static_cast<unsigned char *> (msg_->data ());
    memcpy (ptr, hello_prefix, hello_prefix_len);
    ptr += hello_prefix_len;

    *ptr++ = static_cast<unsigned char> (username.length ());
    memcpy (ptr, username.c_str (), username.length ());
    ptr += username.length ();

    *ptr++ = static_cast<unsigned char> (password.length ());
    memcpy (ptr, password.c_str (), password.length ());
}